

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall
ByteCodeGenerator::InsertPropertyToDebuggerScope
          (ByteCodeGenerator *this,FuncInfo *funcInfo,DebuggerScope *debuggerScope,Symbol *sym)

{
  bool bVar1;
  RegSlot reg;
  PropertyId propertyId;
  FunctionBody *this_00;
  Symbol *pSVar2;
  DebuggerScopePropertyFlags flags;
  
  if (sym != (Symbol *)0x0) {
    this_00 = FuncInfo::GetParsedFunctionBody(funcInfo);
    reg = sym->location;
    bVar1 = ShouldTrackDebuggerMetadata(this);
    flags = 0;
    if ((bVar1) && ((funcInfo->field_0xb5 & 0x80) == 0)) {
      pSVar2 = Scope::FindLocalSymbol(funcInfo->bodyScope,&sym->name);
      flags = 0;
      if (pSVar2 != (Symbol *)0x0) {
        reg = Js::FunctionBody::MapRegSlot(this_00,reg);
        flags = 0x16;
      }
    }
    propertyId = Symbol::EnsurePosition(sym,funcInfo);
    Js::DebuggerScope::AddProperty(debuggerScope,reg,propertyId,flags);
    return;
  }
  return;
}

Assistant:

void ByteCodeGenerator::InsertPropertyToDebuggerScope(FuncInfo* funcInfo, Js::DebuggerScope* debuggerScope, Symbol* sym)
{
    if (sym)
    {
        Js::FunctionBody* funcBody = funcInfo->GetParsedFunctionBody();
        Js::DebuggerScopePropertyFlags flag = Js::DebuggerScopePropertyFlags_None;
        Js::RegSlot location = sym->GetLocation();
        if (ShouldTrackDebuggerMetadata() && !funcInfo->IsBodyAndParamScopeMerged() && funcInfo->bodyScope->FindLocalSymbol(sym->GetName()) != nullptr)
        {
            flag |= Js::DebuggerScopePropertyFlags_HasDuplicateInBody;
            location = funcBody->MapRegSlot(location);
        }

        debuggerScope->AddProperty(location, sym->EnsurePosition(funcInfo), flag);
    }
}